

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O1

int test(char *URL)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  timeval tVar8;
  int maxfd;
  int running;
  long timeout;
  timeval interval;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1f0;
  int local_1ec;
  long local_1e8;
  timeval local_1e0;
  ulong local_1d0;
  char *local_1c8;
  undefined1 local_1bc [4];
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  iVar6 = 0;
  if (iVar2 != 0) {
    test_cold_1();
    iVar6 = iVar2;
  }
  if (iVar6 == 0) {
    lVar3 = curl_easy_init();
    if (lVar3 == 0) {
      test_cold_2();
      iVar6 = 0x7c;
      lVar4 = 0;
    }
    else {
      lVar4 = curl_multi_init();
      if (lVar4 == 0) {
        test_cold_3();
        iVar6 = 0x7b;
      }
      else {
        uVar7 = 0;
        local_1c8 = URL;
        do {
          iVar2 = curl_easy_setopt(lVar3,0x29,1);
          iVar6 = 0;
          if (iVar2 != 0) {
            test_cold_4();
            iVar6 = iVar2;
          }
          if (iVar6 != 0) break;
          iVar2 = curl_easy_setopt(lVar3,0x2712,local_1c8);
          iVar6 = 0;
          if (iVar2 != 0) {
            test_cold_5();
            iVar6 = iVar2;
          }
          if (iVar6 != 0) break;
          if ((uVar7 & 1) == 0) {
            iVar2 = curl_easy_setopt(lVar3,0x8d,1);
            iVar6 = 0;
            if (iVar2 != 0) {
              test_cold_6();
              iVar6 = iVar2;
            }
            if (iVar6 != 0) break;
            if ((int)uVar7 != 0) goto LAB_001027e2;
          }
          else {
LAB_001027e2:
            iVar2 = curl_easy_setopt(lVar3,0x8d,0);
            iVar6 = 0;
            if (iVar2 != 0) {
              test_cold_7();
              iVar6 = iVar2;
            }
            if (iVar6 != 0) break;
            iVar2 = curl_easy_setopt(lVar3,0x2c,1);
            iVar6 = 0;
            if (iVar2 != 0) {
              test_cold_8();
              iVar6 = iVar2;
            }
            if (iVar6 != 0) break;
            iVar2 = curl_easy_setopt(lVar3,0x4b,1);
            iVar6 = 0;
            if (iVar2 != 0) {
              test_cold_9();
              iVar6 = iVar2;
            }
            if (iVar6 != 0) break;
          }
          iVar2 = curl_multi_add_handle(lVar4,lVar3);
          iVar6 = 0;
          if (iVar2 != 0) {
            test_cold_10();
            iVar6 = iVar2;
          }
          if (iVar6 != 0) break;
          iVar6 = 0;
          local_1d0 = uVar7;
          do {
            local_1e8 = -99;
            local_1f0 = -99;
            iVar2 = curl_multi_perform(lVar4,&local_1ec);
            if (iVar2 == 0) {
              if (local_1ec < 0) {
                fprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                        ,0x60);
                iVar6 = 0x7a;
              }
            }
            else {
              test_cold_11();
              iVar6 = iVar2;
            }
            iVar2 = 10;
            if (iVar6 == 0) {
              tVar8 = tutil_tvnow();
              lVar5 = tutil_tvdiff(tVar8,tv_test_start);
              if (lVar5 < 0x1389) {
                if (local_1ec == 0) {
                  iVar6 = 0;
                  iVar2 = 0x2e;
                }
                else {
                  local_b8.__fds_bits[0xe] = 0;
                  local_b8.__fds_bits[0xf] = 0;
                  local_b8.__fds_bits[0xc] = 0;
                  local_b8.__fds_bits[0xd] = 0;
                  local_b8.__fds_bits[10] = 0;
                  local_b8.__fds_bits[0xb] = 0;
                  local_b8.__fds_bits[8] = 0;
                  local_b8.__fds_bits[9] = 0;
                  local_b8.__fds_bits[6] = 0;
                  local_b8.__fds_bits[7] = 0;
                  local_b8.__fds_bits[4] = 0;
                  local_b8.__fds_bits[5] = 0;
                  local_b8.__fds_bits[2] = 0;
                  local_b8.__fds_bits[3] = 0;
                  local_b8.__fds_bits[0] = 0;
                  local_b8.__fds_bits[1] = 0;
                  local_138.__fds_bits[0] = 0;
                  local_138.__fds_bits[1] = 0;
                  local_138.__fds_bits[2] = 0;
                  local_138.__fds_bits[3] = 0;
                  local_138.__fds_bits[4] = 0;
                  local_138.__fds_bits[5] = 0;
                  local_138.__fds_bits[6] = 0;
                  local_138.__fds_bits[7] = 0;
                  local_138.__fds_bits[8] = 0;
                  local_138.__fds_bits[9] = 0;
                  local_138.__fds_bits[10] = 0;
                  local_138.__fds_bits[0xb] = 0;
                  local_138.__fds_bits[0xc] = 0;
                  local_138.__fds_bits[0xd] = 0;
                  local_138.__fds_bits[0xe] = 0;
                  local_138.__fds_bits[0xf] = 0;
                  local_1b8.__fds_bits[0] = 0;
                  local_1b8.__fds_bits[1] = 0;
                  local_1b8.__fds_bits[2] = 0;
                  local_1b8.__fds_bits[3] = 0;
                  local_1b8.__fds_bits[4] = 0;
                  local_1b8.__fds_bits[5] = 0;
                  local_1b8.__fds_bits[6] = 0;
                  local_1b8.__fds_bits[7] = 0;
                  local_1b8.__fds_bits[8] = 0;
                  local_1b8.__fds_bits[9] = 0;
                  local_1b8.__fds_bits[10] = 0;
                  local_1b8.__fds_bits[0xb] = 0;
                  local_1b8.__fds_bits[0xc] = 0;
                  local_1b8.__fds_bits[0xd] = 0;
                  local_1b8.__fds_bits[0xe] = 0;
                  local_1b8.__fds_bits[0xf] = 0;
                  iVar6 = curl_multi_fdset(lVar4,&local_b8,&local_138,&local_1b8,&local_1f0);
                  if (iVar6 == 0) {
                    iVar6 = 0;
                    if (local_1f0 < -1) {
                      fprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                              ,0x6b);
                      iVar6 = 0x7a;
                    }
                  }
                  else {
                    test_cold_13();
                  }
                  if (iVar6 == 0) {
                    iVar6 = curl_multi_timeout(lVar4,&local_1e8);
                    if (iVar6 == 0) {
                      iVar6 = 0;
                      if (local_1e8 < -1) {
                        fprintf(_stderr,
                                "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib597.c"
                                ,0x6f);
                        iVar6 = 0x73;
                      }
                    }
                    else {
                      test_cold_14();
                    }
                    if (iVar6 == 0) {
                      if (local_1e8 == -1) {
                        local_1e0.tv_sec = 6;
                        local_1e0.tv_usec = 0;
                      }
                      else {
                        local_1e0.tv_sec = local_1e8 / 1000;
                        local_1e0.tv_usec = (local_1e8 % 1000) * 1000;
                      }
                      iVar6 = select_wrapper(local_1f0 + 1,&local_b8,&local_138,&local_1b8,
                                             &local_1e0);
                      if (iVar6 == -1) {
                        test_cold_15();
                        iVar6 = 0x79;
                      }
                      else {
                        tVar8 = tutil_tvnow();
                        lVar5 = tutil_tvdiff(tVar8,tv_test_start);
                        iVar2 = 0;
                        iVar6 = 0;
                        if (5000 < lVar5) {
                          test_cold_16();
                          iVar6 = 0x7d;
                          iVar2 = 10;
                        }
                      }
                    }
                  }
                }
              }
              else {
                test_cold_12();
                iVar6 = 0x7d;
              }
            }
          } while (iVar2 == 0);
          if (iVar2 == 10) break;
          if (iVar2 != 0x2e) goto LAB_00102cf6;
          lVar5 = curl_multi_info_read(lVar4,local_1bc);
          if (lVar5 != 0) {
            iVar6 = *(int *)(lVar5 + 0x10);
          }
          iVar2 = curl_multi_remove_handle(lVar4,lVar3);
          uVar1 = local_1d0;
          if (iVar2 != 0) {
            test_cold_17();
            iVar6 = iVar2;
          }
          if (iVar6 != 0) break;
          iVar6 = 0;
          uVar7 = (ulong)((int)uVar1 + 1);
        } while ((int)uVar1 == 0);
      }
    }
    curl_multi_cleanup(lVar4);
    curl_easy_cleanup(lVar3);
    curl_global_cleanup();
  }
LAB_00102cf6:
  return iVar6;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  easy_init(easy);

  multi_init(multi);

  for (phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if (phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if (phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than -1. */

      if(timeout != -1L) {
        interval.tv_sec = timeout/1000;
        interval.tv_usec = (timeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
        interval.tv_usec = 0;
      }

      select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}